

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O2

UnitsPtr __thiscall libcellml::Model::takeUnits(Model *this,size_t index)

{
  long lVar1;
  __shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  UnitsImpl *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  UnitsPtr UVar3;
  
  (this->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity._vptr_Entity =
       (_func_int **)0x0;
  (this->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl =
       (EntityImpl *)0x0;
  lVar1 = *(long *)(index + 8);
  if (in_RDX._M_pi <
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      (*(long *)(lVar1 + 0x90) - *(long *)(lVar1 + 0x88) >> 4)) {
    p_Var2 = &std::
              vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
              ::at((vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
                    *)(lVar1 + 0x88),(size_type)in_RDX._M_pi)->
              super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>;
    std::__shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2> *)this,p_Var2);
    removeUnits((Model *)index,(size_t)in_RDX._M_pi);
    this_00 = Units::pFunc((Units *)(this->super_ComponentEntity).super_NamedEntity.
                                    super_ParentedEntity.super_Entity._vptr_Entity);
    ParentedEntity::ParentedEntityImpl::removeParent((ParentedEntityImpl *)this_00);
    in_RDX._M_pi = extraout_RDX;
  }
  UVar3.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  UVar3.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (UnitsPtr)UVar3.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

UnitsPtr Model::takeUnits(size_t index)
{
    UnitsPtr units = nullptr;
    if (index < pFunc()->mUnits.size()) {
        units = pFunc()->mUnits.at(index);
        removeUnits(index);
        units->pFunc()->removeParent();
    }

    return units;
}